

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

bool __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetSubpassRenderTargets
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this)

{
  Uint32 UVar1;
  FramebufferVkImpl *pFVar2;
  AttachmentReference *pAVar3;
  ShadingRateAttachment *pSVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  SubpassDesc *pSVar8;
  long *plVar9;
  long lVar10;
  ITextureView *pIVar11;
  undefined4 extraout_var;
  char (*in_RCX) [68];
  string *Args_1;
  RenderPassVkImpl *this_00;
  Uint32 rt;
  ulong uVar12;
  ShadingRateAttachment *SRAttachmentRef;
  string msg_2;
  ITextureView *ppRTVs [8];
  undefined1 local_a0 [32];
  RESOURCE_STATE_TRANSITION_MODE local_80;
  string local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((this->m_pBoundFramebuffer).m_pObject == (FramebufferVkImpl *)0x0) {
    FormatString<char[26],char[20]>
              (&local_78,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pBoundFramebuffer",(char (*) [20])in_RCX);
    in_RCX = (char (*) [68])0x4ba;
    DebugAssertionFailed
              (local_78._M_dataplus._M_p,"SetSubpassRenderTargets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x4ba);
    std::__cxx11::string::~string((string *)&local_78);
  }
  this_00 = (this->m_pActiveRenderPass).m_pObject;
  if (this_00 == (RenderPassVkImpl *)0x0) {
    FormatString<char[26],char[20]>
              (&local_78,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pActiveRenderPass",(char (*) [20])in_RCX);
    in_RCX = (char (*) [68])0x4bb;
    DebugAssertionFailed
              (local_78._M_dataplus._M_p,"SetSubpassRenderTargets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x4bb);
    std::__cxx11::string::~string((string *)&local_78);
    this_00 = (this->m_pActiveRenderPass).m_pObject;
  }
  pFVar2 = (this->m_pBoundFramebuffer).m_pObject;
  pSVar8 = RenderPassBase<Diligent::EngineVkImplTraits>::GetSubpass
                     (&this_00->super_RenderPassBase<Diligent::EngineVkImplTraits>,
                      this->m_SubpassIndex);
  this->m_FramebufferSamples = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_78.field_2._8_8_ = 0;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  for (uVar12 = 0; uVar12 < pSVar8->RenderTargetAttachmentCount; uVar12 = uVar12 + 1) {
    pAVar3 = pSVar8->pRenderTargetAttachments;
    uVar6 = pAVar3[uVar12].AttachmentIndex;
    if (uVar6 != 0xffffffff) {
      if ((this_00->super_RenderPassBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
          .m_Desc.AttachmentCount <= uVar6) {
        FormatString<char[26],char[57]>
                  ((string *)local_a0,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"RTAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount",
                   (char (*) [57])in_RCX);
        DebugAssertionFailed
                  ((Char *)CONCAT44(local_a0._4_4_,local_a0._0_4_),"SetSubpassRenderTargets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x4cb);
        std::__cxx11::string::~string((string *)local_a0);
        uVar6 = pAVar3[uVar12].AttachmentIndex;
      }
      in_RCX = (char (*) [68])
               (pFVar2->super_FramebufferBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
               .m_Desc.ppAttachments;
      plVar9 = *(long **)(*in_RCX + (ulong)uVar6 * 8);
      (&local_78._M_dataplus)[uVar12]._M_p = (pointer)plVar9;
      if (plVar9 != (long *)0x0) {
        UVar1 = this->m_FramebufferSamples;
        plVar9 = (long *)(**(code **)(*plVar9 + 0x50))();
        in_RCX = (char (*) [68])*plVar9;
        lVar10 = (**(code **)(*in_RCX + 0x20))(plVar9);
        if (UVar1 == 0) {
          this->m_FramebufferSamples = *(Uint32 *)(lVar10 + 0x20);
        }
        else if (UVar1 != *(Uint32 *)(lVar10 + 0x20)) {
          FormatString<char[26]>((string *)local_a0,(char (*) [26])"Inconsistent sample count");
          in_RCX = (char (*) [68])0x4d2;
          DebugAssertionFailed
                    ((Char *)CONCAT44(local_a0._4_4_,local_a0._0_4_),"SetSubpassRenderTargets",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                     ,0x4d2);
          std::__cxx11::string::~string((string *)local_a0);
        }
      }
    }
  }
  pAVar3 = pSVar8->pDepthStencilAttachment;
  if ((pAVar3 != (AttachmentReference *)0x0) && (pAVar3->AttachmentIndex != 0xffffffff)) {
    if ((this_00->super_RenderPassBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
        .m_Desc.AttachmentCount <= pAVar3->AttachmentIndex) {
      FormatString<char[26],char[57]>
                ((string *)local_a0,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"DSAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount",
                 (char (*) [57])in_RCX);
      in_RCX = (char (*) [68])0x4dc;
      DebugAssertionFailed
                ((Char *)CONCAT44(local_a0._4_4_,local_a0._0_4_),"SetSubpassRenderTargets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x4dc);
      std::__cxx11::string::~string((string *)local_a0);
    }
    if (pAVar3->State == RESOURCE_STATE_DEPTH_READ) {
      pIVar11 = FramebufferBase<Diligent::EngineVkImplTraits>::GetReadOnlyDSV
                          (&((this->m_pBoundFramebuffer).m_pObject)->
                            super_FramebufferBase<Diligent::EngineVkImplTraits>,this->m_SubpassIndex
                          );
    }
    else {
      in_RCX = (char (*) [68])(ulong)pAVar3->AttachmentIndex;
      pIVar11 = (pFVar2->super_FramebufferBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                .m_Desc.ppAttachments[(long)in_RCX];
    }
    if (pIVar11 != (ITextureView *)0x0) {
      UVar1 = this->m_FramebufferSamples;
      iVar7 = (*(pIVar11->super_IDeviceObject).super_IObject._vptr_IObject[10])(pIVar11);
      in_RCX = *(char (**) [68])CONCAT44(extraout_var,iVar7);
      lVar10 = (**(code **)(*in_RCX + 0x20))((long *)CONCAT44(extraout_var,iVar7));
      if (UVar1 == 0) {
        this->m_FramebufferSamples = *(Uint32 *)(lVar10 + 0x20);
      }
      else if (UVar1 != *(Uint32 *)(lVar10 + 0x20)) {
        FormatString<char[26]>((string *)local_a0,(char (*) [26])"Inconsistent sample count");
        in_RCX = (char (*) [68])0x4e5;
        DebugAssertionFailed
                  ((Char *)CONCAT44(local_a0._4_4_,local_a0._0_4_),"SetSubpassRenderTargets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x4e5);
        std::__cxx11::string::~string((string *)local_a0);
      }
      goto LAB_00298784;
    }
  }
  pIVar11 = (ITextureView *)0x0;
LAB_00298784:
  pSVar4 = pSVar8->pShadingRateAttachment;
  if ((pSVar4 == (ShadingRateAttachment *)0x0) ||
     (uVar6 = (pSVar4->Attachment).AttachmentIndex, uVar6 == 0xffffffff)) {
    local_a0._24_8_ = (ITextureView *)0x0;
  }
  else {
    if ((this_00->super_RenderPassBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
        .m_Desc.AttachmentCount <= uVar6) {
      FormatString<char[26],char[68]>
                ((string *)local_a0,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "SRAttachmentRef.Attachment.AttachmentIndex < RPDesc.AttachmentCount",in_RCX);
      DebugAssertionFailed
                ((Char *)CONCAT44(local_a0._4_4_,local_a0._0_4_),"SetSubpassRenderTargets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x4ef);
      std::__cxx11::string::~string((string *)local_a0);
      uVar6 = (pSVar4->Attachment).AttachmentIndex;
    }
    local_a0._24_8_ =
         (pFVar2->super_FramebufferBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
         .m_Desc.ppAttachments[uVar6];
  }
  local_a0._0_4_ = pSVar8->RenderTargetAttachmentCount;
  Args_1 = &local_78;
  local_80 = RESOURCE_STATE_TRANSITION_MODE_NONE;
  local_a0._8_8_ = Args_1;
  local_a0._16_8_ = pIVar11;
  bVar5 = SetRenderTargets(this,(SetRenderTargetsAttribs *)local_a0);
  UVar1 = (pFVar2->super_FramebufferBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
          .m_Desc.Height;
  this->m_FramebufferWidth =
       (pFVar2->super_FramebufferBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
       .m_Desc.Width;
  this->m_FramebufferHeight = UVar1;
  this->m_FramebufferSlices =
       (pFVar2->super_FramebufferBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
       .m_Desc.NumArraySlices;
  if ((this->m_FramebufferSamples == 0) &&
     ((pSVar8->RenderTargetAttachmentCount != 0 ||
      (pSVar8->pDepthStencilAttachment != (AttachmentReference *)0x0)))) {
    FormatString<char[26],char[119]>
              ((string *)local_a0,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "(m_FramebufferSamples > 0) || (Subpass.RenderTargetAttachmentCount == 0 && Subpass.pDepthStencilAttachment == nullptr)"
               ,(char (*) [119])Args_1);
    DebugAssertionFailed
              ((Char *)CONCAT44(local_a0._4_4_,local_a0._0_4_),"SetSubpassRenderTargets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x4fa);
    std::__cxx11::string::~string((string *)local_a0);
  }
  return bVar5;
}

Assistant:

inline bool DeviceContextBase<ImplementationTraits>::SetSubpassRenderTargets()
{
    VERIFY_EXPR(m_pBoundFramebuffer);
    VERIFY_EXPR(m_pActiveRenderPass);

    const RenderPassDesc&  RPDesc  = m_pActiveRenderPass->GetDesc();
    const FramebufferDesc& FBDesc  = m_pBoundFramebuffer->GetDesc();
    const SubpassDesc&     Subpass = m_pActiveRenderPass->GetSubpass(m_SubpassIndex);

    m_FramebufferSamples = 0;

    ITextureView* ppRTVs[MAX_RENDER_TARGETS] = {};
    ITextureView* pDSV                       = nullptr;
    ITextureView* pSRM                       = nullptr;
    for (Uint32 rt = 0; rt < Subpass.RenderTargetAttachmentCount; ++rt)
    {
        const AttachmentReference& RTAttachmentRef = Subpass.pRenderTargetAttachments[rt];
        if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
        {
            VERIFY_EXPR(RTAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount);
            ppRTVs[rt] = FBDesc.ppAttachments[RTAttachmentRef.AttachmentIndex];
            if (ppRTVs[rt] != nullptr)
            {
                if (m_FramebufferSamples == 0)
                    m_FramebufferSamples = ppRTVs[rt]->GetTexture()->GetDesc().SampleCount;
                else
                    DEV_CHECK_ERR(m_FramebufferSamples == ppRTVs[rt]->GetTexture()->GetDesc().SampleCount, "Inconsistent sample count");
            }
        }
    }

    if (Subpass.pDepthStencilAttachment != nullptr)
    {
        const AttachmentReference& DSAttachmentRef = *Subpass.pDepthStencilAttachment;
        if (DSAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
        {
            VERIFY_EXPR(DSAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount);
            pDSV = DSAttachmentRef.State == RESOURCE_STATE_DEPTH_READ ?
                m_pBoundFramebuffer->GetReadOnlyDSV(m_SubpassIndex) :
                FBDesc.ppAttachments[DSAttachmentRef.AttachmentIndex];
            if (pDSV != nullptr)
            {
                if (m_FramebufferSamples == 0)
                    m_FramebufferSamples = pDSV->GetTexture()->GetDesc().SampleCount;
                else
                    DEV_CHECK_ERR(m_FramebufferSamples == pDSV->GetTexture()->GetDesc().SampleCount, "Inconsistent sample count");
            }
        }
    }

    if (Subpass.pShadingRateAttachment != nullptr)
    {
        const ShadingRateAttachment& SRAttachmentRef = *Subpass.pShadingRateAttachment;
        if (SRAttachmentRef.Attachment.AttachmentIndex != ATTACHMENT_UNUSED)
        {
            VERIFY_EXPR(SRAttachmentRef.Attachment.AttachmentIndex < RPDesc.AttachmentCount);
            pSRM = FBDesc.ppAttachments[SRAttachmentRef.Attachment.AttachmentIndex];
        }
    }

    bool BindRenderTargets = SetRenderTargets({Subpass.RenderTargetAttachmentCount, ppRTVs, pDSV, RESOURCE_STATE_TRANSITION_MODE_NONE, pSRM});

    // Use framebuffer dimensions (override what was set by SetRenderTargets)
    m_FramebufferWidth  = FBDesc.Width;
    m_FramebufferHeight = FBDesc.Height;
    m_FramebufferSlices = FBDesc.NumArraySlices;
    VERIFY_EXPR((m_FramebufferSamples > 0) || (Subpass.RenderTargetAttachmentCount == 0 && Subpass.pDepthStencilAttachment == nullptr));

    return BindRenderTargets;
}